

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmSequence(LlvmCompilationContext *ctx,ExprSequence *node)

{
  ExprBase **ppEVar1;
  LLVMValueRef pLVar2;
  uint i;
  uint index;
  
  pLVar2 = (LLVMValueRef)0x0;
  for (index = 0; index < (node->expressions).count; index = index + 1) {
    ppEVar1 = SmallArray<ExprBase_*,_4U>::operator[](&node->expressions,index);
    pLVar2 = CompileLlvm(ctx,*ppEVar1);
  }
  pLVar2 = CheckType(ctx,&node->super_ExprBase,pLVar2);
  return pLVar2;
}

Assistant:

LLVMValueRef CompileLlvmSequence(LlvmCompilationContext &ctx, ExprSequence *node)
{
	LLVMValueRef result = NULL;

	for(unsigned i = 0; i < node->expressions.size(); i++)
		result = CompileLlvm(ctx, node->expressions[i]);

	return CheckType(ctx, node, result);
}